

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_tables.cpp
# Opt level: O3

void ImGui::TablePopBackgroundChannel(void)

{
  ImVec4 *pIVar1;
  int iVar2;
  ImGuiWindow *pIVar3;
  ImGuiTable *pIVar4;
  ImGuiTableColumn *pIVar5;
  ImDrawList *pIVar6;
  ImVec2 IVar7;
  ImVec2 IVar8;
  ImVec2 IVar9;
  
  pIVar3 = GImGui->CurrentWindow;
  pIVar4 = GImGui->CurrentTable;
  iVar2 = pIVar4->CurrentColumn;
  pIVar5 = (pIVar4->Columns).Data;
  IVar7 = (pIVar4->HostBackupInnerClipRect).Min;
  IVar8 = (pIVar4->HostBackupInnerClipRect).Max;
  IVar9 = (pIVar4->HostBackupInnerClipRect).Max;
  (pIVar3->ClipRect).Min = (pIVar4->HostBackupInnerClipRect).Min;
  (pIVar3->ClipRect).Max = IVar9;
  pIVar6 = pIVar3->DrawList;
  (pIVar6->_CmdHeader).ClipRect.x = IVar7.x;
  (pIVar6->_CmdHeader).ClipRect.y = IVar7.y;
  (pIVar6->_CmdHeader).ClipRect.z = IVar8.x;
  (pIVar6->_CmdHeader).ClipRect.w = IVar8.y;
  pIVar1 = (pIVar3->DrawList->_ClipRectStack).Data +
           (long)(pIVar3->DrawList->_ClipRectStack).Size + -1;
  pIVar1->x = IVar7.x;
  pIVar1->y = IVar7.y;
  pIVar1->z = IVar8.x;
  pIVar1->w = IVar8.y;
  ImDrawListSplitter::SetCurrentChannel
            (&pIVar4->DrawSplitter,pIVar3->DrawList,(uint)pIVar5[iVar2].DrawChannelCurrent);
  return;
}

Assistant:

void ImGui::TablePopBackgroundChannel()
{
    ImGuiContext& g = *GImGui;
    ImGuiWindow* window = g.CurrentWindow;
    ImGuiTable* table = g.CurrentTable;
    ImGuiTableColumn* column = &table->Columns[table->CurrentColumn];

    // Optimization: avoid PopClipRect() + SetCurrentChannel()
    SetWindowClipRectBeforeSetChannel(window, table->HostBackupInnerClipRect);
    table->DrawSplitter.SetCurrentChannel(window->DrawList, column->DrawChannelCurrent);
}